

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O0

void __thiscall
Diligent::RenderPassCache::RenderPassCacheKey::RenderPassCacheKey
          (RenderPassCacheKey *this,Uint32 _NumRenderTargets,Uint32 _SampleCount,
          TEXTURE_FORMAT *_RTVFormats,TEXTURE_FORMAT _DSVFormat,bool _EnableVRS,bool _ReadOnlyDSV)

{
  byte bVar1;
  Char *pCVar2;
  TEXTURE_FORMAT *local_88;
  uint local_7c;
  undefined1 local_78 [4];
  Uint32 rt;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  bool _ReadOnlyDSV_local;
  bool _EnableVRS_local;
  TEXTURE_FORMAT _DSVFormat_local;
  TEXTURE_FORMAT *_RTVFormats_local;
  Uint32 _SampleCount_local;
  Uint32 _NumRenderTargets_local;
  RenderPassCacheKey *this_local;
  
  msg.field_2._M_local_buf[0xc] = _ReadOnlyDSV;
  this->NumRenderTargets = (Uint8)_NumRenderTargets;
  this->SampleCount = (Uint8)_SampleCount;
  this->EnableVRS = _EnableVRS;
  this->ReadOnlyDSV = _ReadOnlyDSV;
  this->DSVFormat = _DSVFormat;
  local_88 = this->RTVFormats;
  do {
    *local_88 = TEX_FORMAT_UNKNOWN;
    local_88 = local_88 + 1;
  } while (local_88 != (TEXTURE_FORMAT *)&this->field_0x16);
  this->Hash = 0;
  msg.field_2._M_local_buf[0xd] = _EnableVRS;
  msg.field_2._14_2_ = _DSVFormat;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (bVar1 < _NumRenderTargets) {
    FormatString<char[26],char[76]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "_NumRenderTargets <= std::numeric_limits<decltype(NumRenderTargets)>::max()",
               (char (*) [76])(ulong)bVar1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"RenderPassCacheKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/RenderPassCache.hpp"
               ,0x51);
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (bVar1 < _SampleCount) {
    FormatString<char[26],char[66]>
              ((string *)local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"_SampleCount <= std::numeric_limits<decltype(SampleCount)>::max()",
               (char (*) [66])(ulong)bVar1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"RenderPassCacheKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/RenderPassCache.hpp"
               ,0x52);
    std::__cxx11::string::~string((string *)local_78);
  }
  for (local_7c = 0; local_7c < this->NumRenderTargets; local_7c = local_7c + 1) {
    this->RTVFormats[local_7c] = _RTVFormats[local_7c];
  }
  return;
}

Assistant:

RenderPassCacheKey(Uint32               _NumRenderTargets,
                           Uint32               _SampleCount,
                           const TEXTURE_FORMAT _RTVFormats[],
                           TEXTURE_FORMAT       _DSVFormat,
                           bool                 _EnableVRS,
                           bool                 _ReadOnlyDSV) :
            // clang-format off
            NumRenderTargets{static_cast<decltype(NumRenderTargets)>(_NumRenderTargets)},
            SampleCount     {static_cast<decltype(SampleCount)>     (_SampleCount)     },
            EnableVRS       {_EnableVRS                                                },
            ReadOnlyDSV     {_ReadOnlyDSV                                              },
            DSVFormat       {_DSVFormat                                                }
        // clang-format on
        {
            VERIFY_EXPR(_NumRenderTargets <= std::numeric_limits<decltype(NumRenderTargets)>::max());
            VERIFY_EXPR(_SampleCount <= std::numeric_limits<decltype(SampleCount)>::max());
            for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                RTVFormats[rt] = _RTVFormats[rt];
        }